

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reddit.h
# Opt level: O3

vector<Comment,_std::allocator<Comment>_> * __thiscall
Reddit::requestComments
          (vector<Comment,_std::allocator<Comment>_> *__return_storage_ptr__,Reddit *this)

{
  const_reference pvVar1;
  Json resultJson;
  undefined1 auStack_48 [16];
  _Head_base<0UL,_httplib::ClientImpl_*,_false> local_38;
  _Alloc_hider local_28;
  
  local_38._M_head_impl = (ClientImpl *)&local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"/r/cpp_questions/comments","");
  Client::get((Client *)auStack_48,(string *)&this->client);
  if (local_38._M_head_impl != (ClientImpl *)&local_28) {
    operator_delete(local_38._M_head_impl,(ulong)(local_28._M_p + 1));
  }
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)auStack_48,"data");
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"children");
  extractComments(__return_storage_ptr__,this,pvVar1);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)auStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Comment> requestComments() {
			const Json resultJson = client.get("/r/cpp_questions/comments");
			return extractComments(resultJson["data"]["children"]);
		}